

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::_::Delimited<kj::ArrayPtr<int>_>_>::~Array
          (Array<kj::_::Delimited<kj::ArrayPtr<int>_>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }